

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParsingTests.cpp
# Opt level: O3

void testPostfixUnary(TokenKind kind)

{
  SourceLineInfo *pSVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  SyntaxNode *this;
  SourceManager *sourceManager;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  TokenKind in_DI;
  bool bVar5;
  string_view sVar6;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  AssertionHandler catchAssertionHandler;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> text;
  TokenKind local_f2;
  AssertionHandler local_f0;
  string local_a8;
  string local_88;
  ReusableStringStream local_68;
  undefined1 local_58 [8];
  undefined8 local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined8 local_38;
  string *local_30;
  
  local_f2 = in_DI;
  sVar6 = slang::parsing::LexerFacts::getTokenKindText(in_DI);
  pSVar1 = &local_f0.m_assertionInfo.lineInfo;
  local_f0.m_assertionInfo.macroName.m_start = (char *)pSVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,sVar6._M_str,sVar6._M_str + sVar6._M_len);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0
                      ,0,0,"a",1);
  local_88._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p == paVar4) {
    local_88.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_88.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  }
  else {
    local_88.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_88._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  if ((SourceLineInfo *)local_f0.m_assertionInfo.macroName.m_start != pSVar1) {
    operator_delete(local_f0.m_assertionInfo.macroName.m_start,
                    (size_t)(local_f0.m_assertionInfo.lineInfo.file + 1));
  }
  this = &parseExpression(&local_88)->super_SyntaxNode;
  local_58 = (undefined1  [8])0x9d5e30;
  local_50 = 0x91;
  capturedExpression.m_size = 0x39;
  capturedExpression.m_start = "expr.kind == SyntaxFacts::getUnaryPostfixExpression(kind)";
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  Catch::AssertionHandler::AssertionHandler
            (&local_f0,macroName,(SourceLineInfo *)local_58,capturedExpression,Normal);
  local_a8._M_dataplus._M_p._0_4_ = slang::syntax::SyntaxFacts::getUnaryPostfixExpression(local_f2);
  local_30 = &local_a8;
  local_50._0_2_ = CONCAT11(this->kind == (SyntaxKind)local_a8._M_dataplus._M_p,true);
  local_58 = (undefined1  [8])&PTR_streamReconstructedExpression_00c8b4b8;
  local_48._8_8_ = (long)"!==" + 1;
  local_38 = 2;
  local_48._M_allocated_capacity = (size_type)this;
  Catch::AssertionHandler::handleExpr(&local_f0,(ITransientExpression *)local_58);
  Catch::AssertionHandler::complete(&local_f0);
  if (local_f0.m_completed == false) {
    (*(local_f0.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_58 = (undefined1  [8])0x9d5e30;
  local_50 = 0x92;
  capturedExpression_00.m_size = 0x17;
  capturedExpression_00.m_start = "expr.toString() == text";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_f0,macroName_00,(SourceLineInfo *)local_58,capturedExpression_00,
             ContinueOnFailure);
  slang::syntax::SyntaxNode::toString_abi_cxx11_(&local_a8,this);
  if (local_a8._M_string_length == local_88._M_string_length) {
    if (local_a8._M_string_length == 0) {
      bVar5 = true;
    }
    else {
      iVar2 = bcmp((void *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                    (SyntaxKind)local_a8._M_dataplus._M_p),local_88._M_dataplus._M_p
                   ,local_a8._M_string_length);
      bVar5 = iVar2 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  local_50._0_2_ = CONCAT11(bVar5,true);
  local_58 = (undefined1  [8])&PTR_streamReconstructedExpression_00c8b4e8;
  local_48._8_8_ = (long)"!==" + 1;
  local_38 = 2;
  local_48._M_allocated_capacity = (size_type)&local_a8;
  local_30 = &local_88;
  Catch::AssertionHandler::handleExpr(&local_f0,(ITransientExpression *)local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(SyntaxKind)local_a8._M_dataplus._M_p) !=
      &local_a8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_a8._M_dataplus._M_p._4_4_,(SyntaxKind)local_a8._M_dataplus._M_p),
                    local_a8.field_2._M_allocated_capacity + 1);
  }
  Catch::AssertionHandler::complete(&local_f0);
  if (local_f0.m_completed == false) {
    (*(local_f0.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  sourceManager = getSourceManager();
  slang::Diagnostics::sort((Diagnostics *)&slang::diagnostics,sourceManager);
  if (DAT_00cb2828 != 0) {
    local_58 = (undefined1  [8])0x9d5e30;
    local_50 = 0x93;
    macroName_01.m_size = 10;
    macroName_01.m_start = "FAIL_CHECK";
    Catch::AssertionHandler::AssertionHandler
              (&local_f0,macroName_01,(SourceLineInfo *)local_58,(StringRef)ZEXT816(0x9db414),
               ContinueOnFailure);
    local_68.m_index = 0;
    local_68.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_68);
    reportGlobalDiags_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>
              (local_68.m_oss,
               (char *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                (SyntaxKind)local_a8._M_dataplus._M_p),local_a8._M_string_length);
    Catch::ReusableStringStream::str_abi_cxx11_((string *)local_58,&local_68);
    Catch::AssertionHandler::handleMessage(&local_f0,ExplicitFailure,(string *)local_58);
    if (local_58 != (undefined1  [8])&local_48) {
      operator_delete((void *)local_58,(size_t)(local_48._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(SyntaxKind)local_a8._M_dataplus._M_p) !=
        &local_a8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_a8._M_dataplus._M_p._4_4_,(SyntaxKind)local_a8._M_dataplus._M_p
                              ),local_a8.field_2._M_allocated_capacity + 1);
    }
    Catch::ReusableStringStream::~ReusableStringStream(&local_68);
    Catch::AssertionHandler::complete(&local_f0);
    if (local_f0.m_completed == false) {
      (*(local_f0.m_resultCapture)->_vptr_IResultCapture[0x14])();
    }
  }
  local_58 = (undefined1  [8])0x9d5e30;
  local_50 = 0x95;
  capturedExpression_01.m_size = 0x1d;
  capturedExpression_01.m_start = "us.operatorToken.kind == kind";
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_f0,macroName_02,(SourceLineInfo *)local_58,capturedExpression_01,
             ContinueOnFailure);
  local_48._M_allocated_capacity = (size_type)&this[3].previewNode;
  local_30 = (string *)&local_f2;
  local_50._0_2_ = CONCAT11(*(TokenKind *)&this[3].previewNode == local_f2,true);
  local_58 = (undefined1  [8])&PTR_streamReconstructedExpression_00c8b518;
  local_48._8_8_ = (long)"!==" + 1;
  local_38 = 2;
  Catch::AssertionHandler::handleExpr(&local_f0,(ITransientExpression *)local_58);
  Catch::AssertionHandler::complete(&local_f0);
  if (local_f0.m_completed == false) {
    (*(local_f0.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_58 = (undefined1  [8])0x9d5e30;
  local_50 = 0x96;
  capturedExpression_02.m_size = 0x2e;
  capturedExpression_02.m_start = "us.operand->kind == SyntaxKind::IdentifierName";
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_f0,macroName_03,(SourceLineInfo *)local_58,capturedExpression_02,
             ContinueOnFailure);
  local_48._M_allocated_capacity = *(undefined8 *)(this + 1);
  local_a8._M_dataplus._M_p._0_4_ = 0xe5;
  local_50._0_2_ = CONCAT11(*(int *)local_48._M_allocated_capacity == 0xe5,true);
  local_58 = (undefined1  [8])&PTR_streamReconstructedExpression_00c8b548;
  local_48._8_8_ = (long)"!==" + 1;
  local_38 = 2;
  local_30 = &local_a8;
  Catch::AssertionHandler::handleExpr(&local_f0,(ITransientExpression *)local_58);
  Catch::AssertionHandler::complete(&local_f0);
  if (local_f0.m_completed == false) {
    (*(local_f0.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void testPostfixUnary(TokenKind kind) {
    auto text = "a" + std::string(LF::getTokenKindText(kind));
    auto& expr = parseExpression(text);

    REQUIRE(expr.kind == SyntaxFacts::getUnaryPostfixExpression(kind));
    CHECK(expr.toString() == text);
    CHECK_DIAGNOSTICS_EMPTY;
    auto& us = expr.as<PostfixUnaryExpressionSyntax>();
    CHECK(us.operatorToken.kind == kind);
    CHECK(us.operand->kind == SyntaxKind::IdentifierName);
}